

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

QModelIndexList * __thiscall
QAbstractItemViewPrivate::selectedDraggableIndexes(QAbstractItemViewPrivate *this)

{
  long lVar1;
  QAbstractItemView *pQVar2;
  anon_class_8_1_8991fb9c_for__M_pred in_RSI;
  QList<QModelIndex> *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemView *q;
  QModelIndexList *indexes;
  anon_class_8_1_8991fb9c_for__M_pred isNotDragEnabled;
  QList<QModelIndex> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = q_func(in_RSI.this);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)&(pQVar2->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x2d8))();
  QList<QModelIndex>::removeIf<QAbstractItemViewPrivate::selectedDraggableIndexes()const::__0>
            (this_00,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QModelIndexList QAbstractItemViewPrivate::selectedDraggableIndexes() const
{
    Q_Q(const QAbstractItemView);
    QModelIndexList indexes = q->selectedIndexes();
    auto isNotDragEnabled = [this](const QModelIndex &index) {
        return !isIndexDragEnabled(index);
    };
    indexes.removeIf(isNotDragEnabled);
    return indexes;
}